

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

char * __thiscall CProficiencies::GetSkillLevelName(CProficiencies *this,int ind)

{
  char *pcVar1;
  pointer ppVar2;
  ulong uVar3;
  uint uVar4;
  string_view fmt;
  int ind_local;
  
  if ((uint)ind < 0x19) {
    uVar3 = (ulong)((long)prof_level_table.
                          super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)prof_level_table.
                         super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
    do {
      uVar3 = uVar3 - 1;
      ppVar2 = prof_level_table.
               super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)(uint)uVar3 < 0) goto LAB_003b28bf;
      uVar4 = (uint)uVar3 & 0x7fffffff;
    } while (this->profs[(uint)ind] <
             prof_level_table.super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4].level);
    ppVar2 = prof_level_table.super__Vector_base<prof_level_type,_std::allocator<prof_level_type>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar4;
LAB_003b28bf:
    pcVar1 = ppVar2->name;
  }
  else {
    fmt._M_str = "CProficiencies::GetSkillLevelName : index out of bounds [{}]";
    fmt._M_len = 0x3c;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt,&ind_local);
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* CProficiencies::GetSkillLevelName(int ind)
{
	auto profs_size = std::size(profs);
	if(ind < 0 || ind > profs_size - 1)
	{
		RS.Logger.Warn("CProficiencies::GetSkillLevelName : index out of bounds [{}]", ind);
		return "";
	}

	auto slevel = profs[ind];
	auto prof_level_table_size = std::size(prof_level_table);
	for (int i = prof_level_table_size - 1; i >= 0; i--)
	{
		if (prof_level_table[i].level <= slevel)
			return prof_level_table[i].name;
	}

	return prof_level_table[0].name;
}